

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationsBuilder.cpp
# Opt level: O0

void __thiscall
Refal2::COperationsBuilder::AddMatchRight_S
          (COperationsBuilder *this,CQualifier *qualifier,bool saveInTable)

{
  bool bVar1;
  TOperationType TVar2;
  bool saveInTable_local;
  CQualifier *qualifier_local;
  COperationsBuilder *this_local;
  
  bVar1 = CQualifier::IsEmpty(qualifier);
  if (bVar1) {
    TVar2 = OT_MatchRight_S;
    if (saveInTable) {
      TVar2 = OT_MatchRightSaveToTable_S;
    }
    addNoArgumensOperation(this,TVar2);
  }
  else {
    TVar2 = OT_MatchRightWithQualifier_S;
    if (saveInTable) {
      TVar2 = OT_MatchRightWithQualifierSaveToTable_S;
    }
    addQualifierIndexOperation(this,TVar2,qualifier);
  }
  return;
}

Assistant:

void COperationsBuilder::AddMatchRight_S( CQualifier& qualifier,
	bool saveInTable )
{
	DEBUG_PRINT( __FUNCTION__ )
	if( qualifier.IsEmpty() ) {
		addNoArgumensOperation(
			( saveInTable ? OT_MatchRightSaveToTable_S : OT_MatchRight_S ) );
	} else {
		addQualifierIndexOperation(
			( saveInTable ? OT_MatchRightWithQualifierSaveToTable_S :
			 OT_MatchRightWithQualifier_S ), qualifier );
	}
}